

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * __thiscall logger::Channel::GetPrefix_abi_cxx11_(Channel *this)

{
  long in_RSI;
  string *in_RDI;
  lock_guard<std::mutex> locker;
  mutex_type *in_stack_ffffffffffffffb8;
  string *psVar1;
  
  psVar1 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x38));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13a6c2);
  return psVar1;
}

Assistant:

std::string Channel::GetPrefix() const
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    return Prefix;
}